

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
DynamicHistogram<double>::DynamicHistogram
          (DynamicHistogram<double> *this,DynamicHistogramOptions *options)

{
  value_type_conflict2 local_30;
  
  this->_vptr_DynamicHistogram = (_func_int **)&PTR__DynamicHistogram_00277830;
  this->_binCount = options->binCount;
  this->_binMax = -1.79769313486232e+308;
  this->_binMin = 1.79769313486232e+308;
  this->_binWidth = 0.0;
  FixedSizeCache<double>::FixedSizeCache(&this->_cache,1000);
  this->_enabled = options->enabled;
  (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)&this->_numMerges = 0;
  *(undefined8 *)
   ((long)&(this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FixedSizeCache<double>::initialize(&this->_cache,options->cacheSize);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->_frequencies,(long)options->binCount,&local_30);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->_temp,(long)options->binCount,&local_30);
  return;
}

Assistant:

DynamicHistogram(DynamicHistogramOptions const & options = DynamicHistogramOptions()) :
        _binCount(options.binCount),
        _binMax(-std::numeric_limits<double>::max()),
        _binMin(std::numeric_limits<double>::max()),
        _binWidth(0),
        _enabled(options.enabled),
        _initialized(false),
        _numMerges(0)
    {
        this->_cache.initialize(options.cacheSize);
        this->_frequencies.resize(options.binCount, 0);
        this->_temp.resize(options.binCount, 0);
    }